

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

void MIR_finish(MIR_context_t ctx)

{
  MIR_module_t_conflict *ppMVar1;
  MIR_module_t pMVar2;
  MIR_module_t pMVar3;
  HTAB_MIR_item_t *pHVar4;
  VARR_htab_ind_t *pVVar5;
  MIR_item_t pMVar6;
  io_ctx *piVar7;
  VARR_size_t *__ptr;
  simplify_ctx *psVar8;
  HTAB_val_t *pHVar9;
  machine_code_ctx *pmVar10;
  void *__addr;
  hard_reg_ctx *phVar11;
  HTAB_hard_reg_desc_t *pHVar12;
  VARR_spot_attr_t **ppVVar13;
  MIR_func_t extraout_RAX;
  MIR_func_t pMVar14;
  bitmap_t pVVar15;
  DLIST_LINK_MIR_module_t *pDVar16;
  long *plVar17;
  DLIST_MIR_module_t *pDVar18;
  char *pcVar19;
  MIR_module_t_conflict module;
  char *pcVar20;
  gen_ctx *string;
  gen_ctx *pgVar21;
  gen_ctx *pgVar22;
  gen_ctx *ctx_00;
  long *plVar23;
  MIR_item_t_conflict *ppMVar24;
  long lVar25;
  ulong uVar26;
  int *piVar27;
  gen_ctx *pgVar28;
  gen_ctx *unaff_R14;
  hard_reg_desc_t hVar29;
  
  module = (ctx->all_modules).head;
  if (module != (MIR_module_t_conflict)0x0) {
    unaff_R14 = (gen_ctx *)&ctx->all_modules;
    ppMVar1 = &(ctx->all_modules).tail;
    do {
      pMVar2 = (module->module_link).prev;
      pDVar18 = (DLIST_MIR_module_t *)&(pMVar2->module_link).next;
      if (pMVar2 == (MIR_module_t)0x0) {
        pDVar18 = (DLIST_MIR_module_t *)unaff_R14;
      }
      pDVar18->head = (module->module_link).next;
      pMVar3 = (module->module_link).next;
      if (pMVar3 == (MIR_module_t)0x0) {
        pDVar16 = (DLIST_LINK_MIR_module_t *)ppMVar1;
        if (*ppMVar1 != module) goto LAB_0013082f;
      }
      else {
        pDVar16 = &pMVar3->module_link;
      }
      pDVar16->prev = pMVar2;
      (module->module_link).prev = (MIR_module_t)0x0;
      (module->module_link).next = (MIR_module_t)0x0;
      remove_module(ctx,module,1);
      module = (ctx->all_modules).head;
    } while (module != (MIR_module_t_conflict)0x0);
  }
  pcVar20 = (char *)&ctx->environment_module;
  pgVar21 = (gen_ctx *)ctx;
  remove_module(ctx,(MIR_module_t_conflict)pcVar20,0);
  pHVar4 = ctx->module_item_tab;
  if (pHVar4->free_func == (_func_void_MIR_item_t_void_ptr *)0x0) {
LAB_001300bd:
    pHVar4 = ctx->module_item_tab;
    unaff_R14 = (gen_ctx *)pHVar4->els;
    if ((unaff_R14 == (gen_ctx *)0x0) ||
       (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
       pMVar6 == (MIR_item_t)0x0)) {
LAB_00130834:
      MIR_finish_cold_36();
LAB_00130839:
      MIR_finish_cold_35();
LAB_0013083e:
      MIR_finish_cold_34();
LAB_00130843:
      MIR_finish_cold_33();
LAB_00130848:
      MIR_finish_cold_32();
LAB_0013084d:
      MIR_finish_cold_31();
LAB_00130852:
      MIR_finish_cold_30();
LAB_00130857:
      MIR_finish_cold_29();
LAB_0013085c:
      MIR_finish_cold_28();
LAB_00130861:
      MIR_finish_cold_27();
LAB_00130866:
      MIR_finish_cold_26();
LAB_0013086b:
      MIR_finish_cold_25();
    }
    else {
      free(pMVar6);
      free(unaff_R14);
      pHVar4->els = (VARR_HTAB_EL_MIR_item_t *)0x0;
      pHVar4 = ctx->module_item_tab;
      unaff_R14 = (gen_ctx *)pHVar4->entries;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_00130839;
      free(pMVar6);
      free(unaff_R14);
      pHVar4->entries = (VARR_htab_ind_t *)0x0;
      free(ctx->module_item_tab);
      ctx->module_item_tab = (HTAB_MIR_item_t *)0x0;
      unaff_R14 = (gen_ctx *)ctx->modules_to_link;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_0013083e;
      free(pMVar6);
      free(unaff_R14);
      ctx->modules_to_link = (VARR_MIR_module_t *)0x0;
      unaff_R14 = (gen_ctx *)ctx->temp_ops;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_00130843;
      free(pMVar6);
      free(unaff_R14);
      ctx->temp_ops = (VARR_MIR_op_t *)0x0;
      piVar7 = ctx->io_ctx;
      unaff_R14 = (gen_ctx *)piVar7->func_labels;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_00130848;
      free(pMVar6);
      free(unaff_R14);
      piVar7->func_labels = (VARR_MIR_label_t *)0x0;
      piVar7 = ctx->io_ctx;
      unaff_R14 = (gen_ctx *)piVar7->insn_label_string_nums;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_0013084d;
      free(pMVar6);
      free(unaff_R14);
      piVar7->insn_label_string_nums = (VARR_uint64_t *)0x0;
      piVar7 = ctx->io_ctx;
      unaff_R14 = (gen_ctx *)piVar7->bin_strings;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_00130852;
      free(pMVar6);
      free(unaff_R14);
      piVar7->bin_strings = (VARR_MIR_str_t *)0x0;
      piVar7 = ctx->io_ctx;
      unaff_R14 = (gen_ctx *)piVar7->read_insn_ops;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_00130857;
      free(pMVar6);
      free(unaff_R14);
      piVar7->read_insn_ops = (VARR_MIR_op_t *)0x0;
      piVar7 = ctx->io_ctx;
      unaff_R14 = (gen_ctx *)piVar7->proto_vars;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_0013085c;
      free(pMVar6);
      free(unaff_R14);
      piVar7->proto_vars = (VARR_MIR_var_t *)0x0;
      piVar7 = ctx->io_ctx;
      unaff_R14 = (gen_ctx *)piVar7->proto_types;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_00130861;
      free(pMVar6);
      free(unaff_R14);
      piVar7->proto_types = (VARR_MIR_type_t *)0x0;
      free(ctx->io_ctx);
      ctx->io_ctx = (io_ctx *)0x0;
      unaff_R14 = (gen_ctx *)ctx->temp_data;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_00130866;
      free(pMVar6);
      free(unaff_R14);
      ctx->temp_data = (VARR_uint8_t *)0x0;
      unaff_R14 = (gen_ctx *)ctx->used_label_p;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_0013086b;
      free(pMVar6);
      free(unaff_R14);
      ctx->used_label_p = (VARR_uint8_t *)0x0;
      unaff_R14 = (gen_ctx *)ctx->temp_string;
      if ((unaff_R14 != (gen_ctx *)0x0) &&
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 != (MIR_item_t)0x0)) {
        free(pMVar6);
        free(unaff_R14);
        ctx->temp_string = (VARR_char *)0x0;
        while (unaff_R14 = (gen_ctx *)ctx->unspec_protos, unaff_R14 != (gen_ctx *)0x0) {
          pgVar21 = (gen_ctx *)unaff_R14->ctx;
          pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev;
          if (pgVar21 == (gen_ctx *)0x0) {
            if (pMVar6 == (MIR_item_t)0x0) goto LAB_001308ac;
            free(pMVar6);
            free(unaff_R14);
            ctx->unspec_protos = (VARR_MIR_proto_t *)0x0;
            string_finish(&ctx->string_ctx->strings,&ctx->string_ctx->string_tab);
            pcVar20 = (char *)&ctx->alias_ctx->alias_tab;
            string_finish(&ctx->alias_ctx->aliases,(HTAB_string_t **)pcVar20);
            psVar8 = ctx->simplify_ctx;
            unaff_R14 = (gen_ctx *)psVar8->alloca_sizes;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_00130875;
            free(pMVar6);
            free(unaff_R14);
            psVar8->alloca_sizes = (VARR_size_t *)0x0;
            psVar8 = ctx->simplify_ctx;
            unaff_R14 = (gen_ctx *)psVar8->anchors;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_0013087a;
            free(pMVar6);
            free(unaff_R14);
            psVar8->anchors = (VARR_MIR_insn_t *)0x0;
            psVar8 = ctx->simplify_ctx;
            unaff_R14 = (gen_ctx *)psVar8->inline_reg_map;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_0013087f;
            free(pMVar6);
            free(unaff_R14);
            psVar8->inline_reg_map = (VARR_MIR_reg_t *)0x0;
            psVar8 = ctx->simplify_ctx;
            unaff_R14 = (gen_ctx *)psVar8->labels;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_00130884;
            free(pMVar6);
            free(unaff_R14);
            psVar8->labels = (VARR_MIR_insn_t *)0x0;
            psVar8 = ctx->simplify_ctx;
            unaff_R14 = (gen_ctx *)psVar8->temp_insns;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_00130889;
            free(pMVar6);
            free(unaff_R14);
            psVar8->temp_insns = (VARR_MIR_insn_t *)0x0;
            psVar8 = ctx->simplify_ctx;
            unaff_R14 = (gen_ctx *)psVar8->cold_insns;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_0013088e;
            free(pMVar6);
            free(unaff_R14);
            psVar8->cold_insns = (VARR_MIR_insn_t *)0x0;
            psVar8 = ctx->simplify_ctx;
            if (psVar8->val_tab->free_func != (_func_void_val_t_void_ptr *)0x0) {
              HTAB_val_t_clear(psVar8->val_tab);
            }
            pHVar9 = psVar8->val_tab;
            unaff_R14 = (gen_ctx *)pHVar9->els;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_00130893;
            free(pMVar6);
            free(unaff_R14);
            pHVar9->els = (VARR_HTAB_EL_val_t *)0x0;
            pHVar9 = psVar8->val_tab;
            unaff_R14 = (gen_ctx *)pHVar9->entries;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_00130898;
            free(pMVar6);
            free(unaff_R14);
            pHVar9->entries = (VARR_htab_ind_t *)0x0;
            free(psVar8->val_tab);
            psVar8->val_tab = (HTAB_val_t *)0x0;
            free(ctx->simplify_ctx);
            ctx->simplify_ctx = (simplify_ctx *)0x0;
            unaff_R14 = (gen_ctx *)ctx->insn_nops;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_0013089d;
            free(pMVar6);
            free(unaff_R14);
            ctx->insn_nops = (VARR_size_t *)0x0;
            goto LAB_0013062f;
          }
          if (pMVar6 == (MIR_item_t)0x0) goto LAB_00130820;
          unaff_R14->ctx = (MIR_context_t)((long)&pgVar21[-1].spot_attrs + 7);
          unaff_R14 = *(gen_ctx **)((long)pMVar6 + (long)pgVar21 * 8 + -8);
          __ptr = *(VARR_size_t **)&unaff_R14->debug_level;
          if ((__ptr == (VARR_size_t *)0x0) || (__ptr->varr == (size_t *)0x0)) {
            MIR_finish_cold_4();
            break;
          }
          free(__ptr->varr);
          free(__ptr);
          *(VARR_size_t **)&unaff_R14->debug_level = (VARR_size_t *)0x0;
          free(unaff_R14);
        }
        MIR_finish_cold_23();
LAB_00130820:
        MIR_finish_cold_5();
LAB_00130825:
        MIR_finish_cold_12();
LAB_0013082a:
        MIR_finish_cold_6();
LAB_0013082f:
        MIR_finish_cold_1();
        goto LAB_00130834;
      }
    }
    MIR_finish_cold_24();
LAB_00130875:
    MIR_finish_cold_21();
LAB_0013087a:
    MIR_finish_cold_20();
LAB_0013087f:
    MIR_finish_cold_19();
LAB_00130884:
    MIR_finish_cold_18();
LAB_00130889:
    MIR_finish_cold_17();
LAB_0013088e:
    MIR_finish_cold_16();
LAB_00130893:
    MIR_finish_cold_15();
LAB_00130898:
    MIR_finish_cold_14();
LAB_0013089d:
    MIR_finish_cold_13();
LAB_001308a2:
    MIR_finish_cold_10();
LAB_001308a7:
    MIR_finish_cold_9();
LAB_001308ac:
    MIR_finish_cold_22();
LAB_001308b1:
    MIR_finish_cold_11();
    pMVar14 = extraout_RAX;
LAB_001308b6:
    pcVar19 = pMVar14->name;
    pcVar20 = "finish when function %s is not finished";
LAB_001308cd:
    pgVar21 = (gen_ctx *)0x4;
    (*ctx->error_func)(MIR_finish_error,pcVar20,pcVar19);
LAB_001308d7:
    MIR_finish_cold_3();
  }
  else {
    if (pHVar4->els == (VARR_HTAB_EL_MIR_item_t *)0x0) goto LAB_001308d7;
    if (pHVar4->els_bound != 0) {
      unaff_R14 = (gen_ctx *)pHVar4->arg;
      ppMVar24 = &pHVar4->els->varr->el;
      uVar26 = 0;
      do {
        if (((HTAB_EL_MIR_item_t *)(ppMVar24 + -1))->hash != 0) {
          pgVar21 = (gen_ctx *)*ppMVar24;
          pcVar20 = (char *)unaff_R14;
          (*pHVar4->free_func)((MIR_item_t_conflict)pgVar21,unaff_R14);
        }
        uVar26 = uVar26 + 1;
        ppMVar24 = ppMVar24 + 2;
      } while (uVar26 < pHVar4->els_bound);
    }
    pHVar4->els_bound = 0;
    pHVar4->els_num = 0;
    pHVar4->els_start = 0;
    pVVar5 = pHVar4->entries;
    if (pVVar5 != (VARR_htab_ind_t *)0x0) {
      if ((int)pVVar5->els_num != 0) {
        memset(pVVar5->varr,0xff,(pVVar5->els_num & 0xffffffff) << 2);
      }
      goto LAB_001300bd;
    }
  }
  MIR_finish_cold_2();
LAB_001308e1:
  MIR_finish_cold_8();
LAB_001308e6:
  MIR_finish_cold_7();
  ctx_00 = (gen_ctx *)pgVar21->ctx;
  string = (gen_ctx *)pcVar20;
  pgVar22 = pgVar21;
  if (ctx_00 != (gen_ctx *)0x0) {
    lVar25 = 0x28;
    pgVar28 = (gen_ctx *)0x0;
    do {
      pgVar22 = (gen_ctx *)((DLIST_LINK_MIR_item_t *)&ctx_00->curr_func_item)->prev;
      pgVar28 = (gen_ctx *)((long)&pgVar28->ctx + 1);
      if ((gen_ctx *)ctx_00->ctx <= pgVar28) goto LAB_00130935;
      pgVar22 = *(gen_ctx **)((long)&pgVar22->ctx + lVar25);
      lVar25 = lVar25 + 0x18;
      free(pgVar22);
      ctx_00 = (gen_ctx *)pgVar21->ctx;
      ctx = (MIR_context_t)pcVar20;
      unaff_R14 = pgVar21;
    } while (ctx_00 != (gen_ctx *)0x0);
  }
  pgVar21 = unaff_R14;
  pcVar20 = (char *)ctx;
  string_finish_cold_6();
LAB_00130935:
  if (pgVar22 == (gen_ctx *)0x0) {
LAB_00130a64:
    string_finish_cold_5();
    ctx_00 = pgVar22;
LAB_00130a69:
    string_finish_cold_2();
  }
  else {
    free(pgVar22);
    free(ctx_00);
    pgVar21->ctx = (MIR_context_t)0x0;
    pgVar21 = (gen_ctx *)((gen_ctx *)pcVar20)->ctx;
    if (pgVar21->to_free == (VARR_void_ptr_t *)0x0) {
LAB_001309ee:
      pgVar21 = (gen_ctx *)((gen_ctx *)pcVar20)->ctx;
      pgVar22 = *(gen_ctx **)&pgVar21->addr_insn_p;
      if ((pgVar22 == (gen_ctx *)0x0) ||
         (ctx_00 = (gen_ctx *)((DLIST_LINK_MIR_item_t *)&pgVar22->curr_func_item)->prev,
         ctx_00 == (gen_ctx *)0x0)) {
        pgVar22 = ctx_00;
        string_finish_cold_4();
      }
      else {
        free(ctx_00);
        free(pgVar22);
        *(undefined8 *)&pgVar21->addr_insn_p = 0;
        pgVar21 = (gen_ctx *)((gen_ctx *)pcVar20)->ctx;
        pVVar15 = pgVar21->tied_regs;
        if ((pVVar15 != (bitmap_t)0x0) &&
           (pgVar22 = (gen_ctx *)pVVar15->varr, pgVar22 != (gen_ctx *)0x0)) {
          free(pgVar22);
          free(pVVar15);
          pgVar21->tied_regs = (bitmap_t)0x0;
          free((gen_ctx *)((gen_ctx *)pcVar20)->ctx);
          ((gen_ctx *)pcVar20)->ctx = (MIR_context_t)0x0;
          return;
        }
      }
      string_finish_cold_3();
      goto LAB_00130a64;
    }
    if (*(long *)&pgVar21->addr_insn_p == 0) goto LAB_00130a69;
    if (pgVar21->optimize_level != 0) {
      pgVar22 = (gen_ctx *)pgVar21->curr_func_item;
      lVar25 = *(long *)(*(long *)&pgVar21->addr_insn_p + 0x10) + 8;
      uVar26 = 0;
      do {
        if (*(int *)(lVar25 + -8) != 0) {
          ctx_00 = pgVar22;
          (*(code *)pgVar21->to_free)();
        }
        uVar26 = uVar26 + 1;
        lVar25 = lVar25 + 0x20;
      } while (uVar26 < pgVar21->optimize_level);
    }
    pgVar21->optimize_level = 0;
    pgVar21->ctx = (MIR_context_t)0x0;
    pVVar15 = pgVar21->tied_regs;
    if (pVVar15 != (bitmap_t)0x0) {
      if ((int)pVVar15->els_num != 0) {
        ctx_00 = (gen_ctx *)pVVar15->varr;
        string = (gen_ctx *)0xff;
        memset(ctx_00,0xff,(pVVar15->els_num & 0xffffffff) << 2);
      }
      goto LAB_001309ee;
    }
  }
  string_finish_cold_1();
  if (ctx_00->call_used_hard_regs[4] == (bitmap_t)0x0) {
    pVVar15 = (bitmap_t)malloc(0x38);
    ctx_00->call_used_hard_regs[4] = pVVar15;
    if (pVVar15 != (bitmap_t)0x0) {
      pVVar15->els_num = 0;
      *(undefined4 *)&pVVar15[2].els_num = 0;
      pcVar20 = get_ctx_str((MIR_context_t)ctx_00,(char *)string);
      pVVar15->size = (size_t)pcVar20;
      pVVar15->varr = (bitmap_el_t *)0x0;
      pVVar15[1].els_num = 0;
      DLIST_MIR_module_t_append
                ((DLIST_MIR_module_t *)(ctx_00->call_used_hard_regs + 7),
                 (MIR_module_t_conflict)ctx_00->call_used_hard_regs[4]);
      return;
    }
    pcVar20 = "Not enough memory for module %s creation";
    plVar23 = (long *)0x3;
  }
  else {
    string = (gen_ctx *)ctx_00->call_used_hard_regs[4]->size;
    pcVar20 = "Creating module when previous module %s is not finished";
    plVar23 = (long *)0x6;
  }
  (*(code *)ctx_00->curr_func_item)((MIR_error_type_t)plVar23,pcVar20,string);
  if ((plVar23 == (long *)0x0) || (pcVar20 == (char *)0x0)) {
    DLIST_MIR_module_t_append_cold_1();
  }
  else {
    lVar25 = plVar23[1];
    if (lVar25 == 0) {
      plVar17 = plVar23;
      if (*plVar23 == 0) goto LAB_00130b3a;
      goto LAB_00130b59;
    }
    if (*(long *)(lVar25 + 0x28) == 0) {
      plVar17 = (long *)(lVar25 + 0x28);
LAB_00130b3a:
      *plVar17 = (long)pcVar20;
      pcVar20[0x28] = '\0';
      pcVar20[0x29] = '\0';
      pcVar20[0x2a] = '\0';
      pcVar20[0x2b] = '\0';
      pcVar20[0x2c] = '\0';
      pcVar20[0x2d] = '\0';
      pcVar20[0x2e] = '\0';
      pcVar20[0x2f] = '\0';
      *(long *)(pcVar20 + 0x20) = lVar25;
      plVar23[1] = (long)pcVar20;
      return;
    }
  }
  DLIST_MIR_module_t_append_cold_2();
LAB_00130b59:
  DLIST_MIR_module_t_append_cold_3();
  return;
LAB_0013062f:
  pmVar10 = ctx->machine_code_ctx;
  unaff_R14 = (gen_ctx *)pmVar10->code_holders;
  if (unaff_R14 != (gen_ctx *)0x0) {
    if ((gen_ctx *)unaff_R14->ctx != (gen_ctx *)0x0) {
      pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev;
      if (pMVar6 != (MIR_item_t)0x0) goto code_r0x00130657;
      goto LAB_0013082a;
    }
    pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev;
    if (pMVar6 == (MIR_item_t)0x0) goto LAB_001308b1;
    free(pMVar6);
    free(unaff_R14);
    unaff_R14 = (gen_ctx *)0x0;
    pmVar10->code_holders = (VARR_code_holder_t *)0x0;
    pgVar21 = (gen_ctx *)ctx->machine_code_ctx;
    free(pgVar21);
    ctx->machine_code_ctx = (machine_code_ctx *)0x0;
    phVar11 = ctx->hard_reg_ctx;
    pHVar12 = phVar11->hard_reg_desc_tab;
    if (pHVar12->free_func == (_func_void_hard_reg_desc_t_void_ptr *)0x0) goto LAB_00130743;
    if (pHVar12->els != (VARR_HTAB_EL_hard_reg_desc_t *)0x0) {
      if (pHVar12->els_bound != 0) {
        unaff_R14 = (gen_ctx *)pHVar12->arg;
        piVar27 = &(pHVar12->els->varr->el).num;
        uVar26 = 0;
        do {
          if (piVar27[-4] != 0) {
            pgVar21 = (gen_ctx *)((hard_reg_desc_t *)(piVar27 + -2))->name;
            hVar29.num = *piVar27;
            hVar29.name = (char *)pgVar21;
            hVar29._12_4_ = 0;
            pcVar20 = (char *)(ulong)(uint)*piVar27;
            (*pHVar12->free_func)(hVar29,unaff_R14);
          }
          uVar26 = uVar26 + 1;
          piVar27 = piVar27 + 6;
        } while (uVar26 < pHVar12->els_bound);
      }
      pHVar12->els_bound = 0;
      pHVar12->els_num = 0;
      pHVar12->els_start = 0;
      pVVar5 = pHVar12->entries;
      if (pVVar5 == (VARR_htab_ind_t *)0x0) goto LAB_001308e6;
      if ((int)pVVar5->els_num != 0) {
        memset(pVVar5->varr,0xff,(pVVar5->els_num & 0xffffffff) << 2);
      }
LAB_00130743:
      pHVar12 = phVar11->hard_reg_desc_tab;
      unaff_R14 = (gen_ctx *)pHVar12->els;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_001308a2;
      free(pMVar6);
      free(unaff_R14);
      pHVar12->els = (VARR_HTAB_EL_hard_reg_desc_t *)0x0;
      pHVar12 = phVar11->hard_reg_desc_tab;
      unaff_R14 = (gen_ctx *)pHVar12->entries;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_001308a7;
      free(pMVar6);
      free(unaff_R14);
      unaff_R14 = (gen_ctx *)0x0;
      pHVar12->entries = (VARR_htab_ind_t *)0x0;
      free(phVar11->hard_reg_desc_tab);
      phVar11->hard_reg_desc_tab = (HTAB_hard_reg_desc_t *)0x0;
      free(ctx->hard_reg_ctx);
      ctx->hard_reg_ctx = (hard_reg_ctx *)0x0;
      pMVar14 = ctx->curr_func;
      if (pMVar14 != (MIR_func_t)0x0) goto LAB_001308b6;
      if (ctx->curr_module == (MIR_module_t_conflict)0x0) {
        free(ctx->string_ctx);
        free(ctx->alias_ctx);
        free(ctx);
        return;
      }
      pcVar19 = ctx->curr_module->name;
      pcVar20 = "finish when module %s is not finished";
      goto LAB_001308cd;
    }
    goto LAB_001308e1;
  }
  goto LAB_00130825;
code_r0x00130657:
  ppVVar13 = &((gen_ctx *)unaff_R14->ctx)[-1].spot_attrs;
  unaff_R14->ctx = (MIR_context_t)((long)ppVVar13 + 7);
  __addr = *(void **)((long)&pMVar6[2].item_link + (long)ppVVar13 * 0x18 + 8);
  pcVar20 = (char *)((long)(&pMVar6[2].ref_def)[(long)ppVVar13 * 3] - (long)__addr);
  munmap(__addr,(size_t)pcVar20);
  goto LAB_0013062f;
}

Assistant:

void MIR_finish (MIR_context_t ctx) {
  interp_finish (ctx);
  remove_all_modules (ctx);
  HTAB_DESTROY (MIR_item_t, module_item_tab);
  VARR_DESTROY (MIR_module_t, modules_to_link);
  VARR_DESTROY (MIR_op_t, temp_ops);
#if !MIR_NO_SCAN
  scan_finish (ctx);
#endif
#if !MIR_NO_IO
  io_finish (ctx);
#endif
  VARR_DESTROY (uint8_t, temp_data);
  VARR_DESTROY (uint8_t, used_label_p);
  VARR_DESTROY (char, temp_string);
  while (VARR_LENGTH (MIR_proto_t, unspec_protos) != 0) {
    MIR_proto_t proto = VARR_POP (MIR_proto_t, unspec_protos);
    VARR_DESTROY (MIR_var_t, proto->args);
    free (proto);
  }
  VARR_DESTROY (MIR_proto_t, unspec_protos);
  string_finish (&strings, &string_tab);
  string_finish (&aliases, &alias_tab);
  simplify_finish (ctx);
  VARR_DESTROY (size_t, insn_nops);
  code_finish (ctx);
  hard_reg_name_finish (ctx);
  if (curr_func != NULL)
    MIR_get_error_func (ctx) (MIR_finish_error, "finish when function %s is not finished",
                              curr_func->name);
  if (curr_module != NULL)
    MIR_get_error_func (ctx) (MIR_finish_error, "finish when module %s is not finished",
                              curr_module->name);
  free (ctx->string_ctx);
  free (ctx->alias_ctx);
  free (ctx);
  ctx = NULL;
}